

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O3

StatusOr<int>
google::protobuf::json_internal::Proto2Descriptor::EnumNumberByName
          (Field f,string_view name,bool case_insensitive)

{
  undefined8 *puVar1;
  char cVar2;
  int iVar3;
  EnumDescriptor *pEVar4;
  EnumValueDescriptor *pEVar5;
  undefined8 extraout_RAX;
  undefined7 in_register_00000009;
  char *pcVar6;
  char *pcVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar8;
  long lVar9;
  FieldDescriptor *this;
  int in_R8D;
  long lVar10;
  string_view name_00;
  StatusOr<int> SVar11;
  Status local_80;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_78;
  long *local_70;
  undefined8 local_68;
  long local_60 [2];
  char *local_50;
  char *local_48;
  char **local_40;
  code *local_38;
  
  pcVar6 = (char *)CONCAT71(in_register_00000009,case_insensitive);
  pcVar7 = name._M_str;
  this = (FieldDescriptor *)name._M_len;
  local_50 = pcVar7;
  local_48 = pcVar6;
  pEVar4 = FieldDescriptor::enum_type(this);
  if (in_R8D == 0) {
    name_00._M_str = pcVar6;
    name_00._M_len = (size_t)pcVar7;
    pEVar5 = EnumDescriptor::FindValueByName(pEVar4,name_00);
    if (pEVar5 != (EnumValueDescriptor *)0x0) {
      iVar3 = pEVar5->number_;
      uVar8 = extraout_RDX_02;
      local_78 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)f;
LAB_002c866a:
      *(int *)((long)local_78 + 8) = iVar3;
      *(undefined8 *)local_78 = 1;
      f = (Field)local_78;
      goto LAB_002c8674;
    }
    local_40 = &local_50;
    local_38 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
              (&local_70,"unknown enum value: \'%s\'",0x18,&local_40,1);
    absl::lts_20240722::InvalidArgumentError(&local_80,local_68,local_70);
    absl::lts_20240722::internal_statusor::StatusOrData<int>::
    StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,&local_80);
    uVar8 = extraout_RDX_03;
    if ((local_80.rep_ & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
      uVar8 = extraout_RDX_04;
    }
  }
  else {
    local_78 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)f;
    if (0 < pEVar4->value_count_) {
      lVar9 = 8;
      lVar10 = 0;
      do {
        pEVar4 = FieldDescriptor::enum_type(this);
        if (pEVar4->value_count_ <= lVar10) {
          EnumNumberByName();
          __clang_call_terminate(extraout_RAX);
        }
        pEVar5 = pEVar4->values_;
        puVar1 = *(undefined8 **)(&pEVar5->super_SymbolBaseN<0> + lVar9);
        cVar2 = absl::lts_20240722::EqualsIgnoreCase(pcVar7,pcVar6,puVar1[1],*puVar1);
        if (cVar2 != '\0') {
          iVar3 = *(int *)((long)pEVar5 + lVar9 + -4);
          uVar8 = extraout_RDX;
          goto LAB_002c866a;
        }
        lVar10 = lVar10 + 1;
        pEVar4 = FieldDescriptor::enum_type(this);
        lVar9 = lVar9 + 0x30;
      } while (lVar10 < pEVar4->value_count_);
    }
    local_40 = &local_50;
    local_38 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
    absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
              (&local_70,"unknown enum value: \'%s\'",0x18,&local_40,1);
    absl::lts_20240722::InvalidArgumentError(&local_80,local_68,local_70);
    f = (Field)local_78;
    absl::lts_20240722::internal_statusor::StatusOrData<int>::
    StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<int> *)local_78,&local_80);
    uVar8 = extraout_RDX_00;
    if ((local_80.rep_ & 1) == 0) {
      absl::lts_20240722::status_internal::StatusRep::Unref();
      uVar8 = extraout_RDX_01;
    }
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
    uVar8 = extraout_RDX_05;
  }
LAB_002c8674:
  SVar11.super_StatusOrData<int>._8_8_ = uVar8;
  SVar11.super_StatusOrData<int>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)f;
  return (StatusOr<int>)SVar11.super_StatusOrData<int>;
}

Assistant:

static absl::StatusOr<int32_t> EnumNumberByName(Field f,
                                                  absl::string_view name,
                                                  bool case_insensitive) {
    if (case_insensitive) {
      for (int i = 0; i < f->enum_type()->value_count(); ++i) {
        const auto* ev = f->enum_type()->value(i);
        if (absl::EqualsIgnoreCase(name, ev->name())) {
          return ev->number();
        }
      }
      return absl::InvalidArgumentError(
          absl::StrFormat("unknown enum value: '%s'", name));
    }

    if (const auto* ev = f->enum_type()->FindValueByName(name)) {
      return ev->number();
    }

    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum value: '%s'", name));
  }